

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveSelectStep(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  u8 uVar2;
  Parse *pParse;
  NameContext *pOuterNC;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Select *pSVar5;
  char *pcVar6;
  ExprList *pEVar7;
  sqlite3 *psVar8;
  Expr *pEVar9;
  anon_union_8_3_1bb8468b_for_uNC aVar10;
  byte bVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  NameContext *pNVar17;
  Expr *p_00;
  Expr *pEVar18;
  ExprList_item *pEVar19;
  ulong uVar20;
  ulong uVar21;
  Expr *pE;
  Expr *pEVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  ExprList_item *pEVar27;
  Parse *pPVar28;
  Parse *pPVar29;
  bool bVar30;
  NameContext sNC;
  int local_d4;
  Expr *local_d0;
  sqlite3 *local_c8;
  Select *local_c0;
  NameContext local_b8;
  Expr *local_80;
  anon_union_8_3_1bb8468b_for_uNC local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  iVar13 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (pWalker->u).pNC;
    psVar3 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC);
      iVar13 = 2;
      if (pParse->nErr == 0) {
        iVar13 = 2 - (uint)(psVar3->mallocFailed == '\0');
      }
    }
    else {
      local_c0 = p->pPrior;
      iVar13 = 0;
      local_c8 = (sqlite3 *)p;
      for (; p != (Select *)0x0; p = p->pPrior) {
        *(byte *)&p->selFlags = (byte)p->selFlags | 4;
        local_b8.pNext = (NameContext *)0x0;
        local_b8.nRef = 0;
        local_b8.nErr = 0;
        local_b8.ncFlags = 0;
        local_b8._42_6_ = 0;
        local_b8.pSrcList = (SrcList *)0x0;
        local_b8.uNC.pEList = (ExprList *)0x0;
        local_b8.pParse = pParse;
        local_b8.pWinSelect = p;
        iVar14 = sqlite3ResolveExprNames(&local_b8,p->pLimit);
        if (iVar14 != 0) goto LAB_00173946;
        if ((p->selFlags & 0x10000) != 0) {
          (p->pSrc->a[0].pSelect)->pOrderBy = p->pOrderBy;
          p->pOrderBy = (ExprList *)0x0;
        }
        for (lVar26 = 0; pSVar4 = p->pSrc, lVar26 < pSVar4->nSrc; lVar26 = lVar26 + 1) {
          pSVar5 = pSVar4->a[lVar26].pSelect;
          if (pSVar5 != (Select *)0x0) {
            pcVar25 = pParse->zAuthContext;
            iVar14 = 0;
            for (pNVar17 = pOuterNC; pNVar17 != (NameContext *)0x0; pNVar17 = pNVar17->pNext) {
              iVar14 = iVar14 + pNVar17->nRef;
            }
            pcVar6 = pSVar4->a[lVar26].zName;
            if (pcVar6 != (char *)0x0) {
              pParse->zAuthContext = pcVar6;
            }
            sqlite3ResolveSelectNames(pParse,pSVar5,pOuterNC);
            pParse->zAuthContext = pcVar25;
            if ((pParse->nErr != 0) || (pNVar17 = pOuterNC, psVar3->mallocFailed != '\0'))
            goto LAB_00173946;
            for (; pNVar17 != (NameContext *)0x0; pNVar17 = pNVar17->pNext) {
              iVar14 = iVar14 - pNVar17->nRef;
            }
            pSVar4->a[lVar26].fg.field_0x1 =
                 pSVar4->a[lVar26].fg.field_0x1 & 0xf7 | (iVar14 != 0) << 3;
          }
        }
        local_b8.ncFlags = 0x4001;
        local_b8.pSrcList = pSVar4;
        local_b8.pNext = pOuterNC;
        iVar14 = sqlite3ResolveExprListNames(&local_b8,p->pEList);
        if (iVar14 != 0) goto LAB_00173946;
        uVar12 = local_b8.ncFlags & 0xbfff;
        pEVar7 = p->pGroupBy;
        if ((byte)((byte)((local_b8.ncFlags & 0x10) >> 4) | pEVar7 != (ExprList *)0x0) == 1) {
          p->selFlags = local_b8.ncFlags & 0x1000 | p->selFlags | 8;
        }
        else {
          uVar12 = local_b8.ncFlags & 0xbfee;
        }
        local_b8.ncFlags = uVar12;
        if (p->pHaving != (Expr *)0x0 && pEVar7 == (ExprList *)0x0) {
          pcVar25 = "a GROUP BY clause is required before HAVING";
          goto LAB_0017393f;
        }
        local_b8.uNC.pEList = p->pEList;
        local_b8._40_8_ = CONCAT62(local_b8._42_6_,uVar12) | 0x80;
        iVar14 = sqlite3ResolveExprNames(&local_b8,p->pHaving);
        if ((iVar14 != 0) || (iVar14 = sqlite3ResolveExprNames(&local_b8,p->pWhere), iVar14 != 0))
        goto LAB_00173946;
        lVar26 = 0x68;
        for (lVar24 = 0; pSVar4 = p->pSrc, lVar24 < pSVar4->nSrc; lVar24 = lVar24 + 1) {
          if (((*(byte *)((long)pSVar4->a + lVar26 + -0x2b) & 4) != 0) &&
             (iVar14 = sqlite3ResolveExprListNames
                                 (&local_b8,*(ExprList **)((long)pSVar4->a + lVar26 + -8)),
             iVar14 != 0)) goto LAB_00173946;
          lVar26 = lVar26 + 0x70;
        }
        local_b8.pNext = (NameContext *)0x0;
        local_b8._40_8_ = local_b8._40_8_ | 0x4001;
        if ((p->selFlags & 0x10000) != 0) {
          pSVar5 = pSVar4->a[0].pSelect;
          p->pOrderBy = pSVar5->pOrderBy;
          pSVar5->pOrderBy = (ExprList *)0x0;
        }
        if (((local_c0 == (Select *)0x0 || iVar13 != 0) &&
            (iVar14 = resolveOrderGroupBy(&local_b8,p,p->pOrderBy,"ORDER"), iVar14 != 0)) ||
           (psVar3->mallocFailed != '\0')) goto LAB_00173946;
        local_b8._40_8_ = local_b8._40_8_ & 0xffffffffffffbfff;
        if (pEVar7 != (ExprList *)0x0) {
          iVar14 = resolveOrderGroupBy(&local_b8,p,pEVar7,"GROUP");
          if ((iVar14 != 0) || (psVar3->mallocFailed != '\0')) goto LAB_00173946;
          iVar14 = pEVar7->nExpr;
          pEVar27 = pEVar7->a;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          while (bVar30 = iVar14 != 0, iVar14 = iVar14 + -1, bVar30) {
            if ((pEVar27->pExpr->flags & 2) != 0) {
              pcVar25 = "aggregate functions are not allowed in the GROUP BY clause";
              goto LAB_0017393f;
            }
            pEVar27 = pEVar27 + 1;
          }
        }
        pSVar5 = p->pNext;
        if ((pSVar5 != (Select *)0x0) && (p->pEList->nExpr != pSVar5->pEList->nExpr)) {
          if ((pSVar5->selFlags & 0x200) == 0) {
            bVar11 = pSVar5->op + 0x84;
            if (bVar11 < 3) {
              pcVar25 = (&PTR_anon_var_dwarf_69b4d_001c0ca8)[bVar11];
            }
            else {
              pcVar25 = "UNION";
            }
            sqlite3ErrorMsg(pParse,
                            "SELECTs to the left and right of %s do not have the same number of result columns"
                            ,pcVar25);
            return 2;
          }
          pcVar25 = "all VALUES must have the same number of terms";
          goto LAB_0017393f;
        }
        iVar13 = iVar13 + 1;
      }
      if (local_c0 == (Select *)0x0) {
        iVar13 = 1;
      }
      else {
        pEVar7 = *(ExprList **)&local_c8->nSchemaLock;
        iVar13 = 1;
        if (pEVar7 != (ExprList *)0x0) {
          psVar3 = pParse->db;
          uVar16 = pEVar7->nExpr;
          if (psVar3->aLimit[2] < (int)uVar16) {
            pcVar25 = "too many terms in ORDER BY clause";
LAB_0017393f:
            sqlite3ErrorMsg(pParse,pcVar25);
LAB_00173946:
            iVar13 = 2;
          }
          else {
            local_70 = pEVar7->a;
            lVar26 = 0;
            uVar21 = 0;
            if (0 < (int)uVar16) {
              uVar21 = (ulong)uVar16;
            }
            for (; uVar21 * 0x20 != lVar26; lVar26 = lVar26 + 0x20) {
              pbVar1 = &pEVar7->a[0].field_0x19 + lVar26;
              *pbVar1 = *pbVar1 & 0xfe;
            }
            psVar8 = local_c8;
            pPVar28 = (Parse *)0x0;
            do {
              pPVar29 = (Parse *)psVar8;
              pPVar29->pConstExpr = (ExprList *)pPVar28;
              psVar8 = (sqlite3 *)pPVar29->aLabel;
              pPVar28 = pPVar29;
            } while ((Parse *)pPVar29->aLabel != (Parse *)0x0);
            iVar13 = 1;
            while ((pPVar29 != (Parse *)0x0 && (iVar13 != 0))) {
              local_c8 = pPVar29->db;
              iVar13 = 0;
              pEVar27 = local_70;
              for (iVar14 = 0; iVar14 < (int)uVar16; iVar14 = iVar14 + 1) {
                local_d4 = -1;
                if ((pEVar27->field_0x19 & 1) == 0) {
                  local_c0 = (Select *)CONCAT44(local_c0._4_4_,iVar13);
                  p_00 = sqlite3ExprSkipCollate(pEVar27->pExpr);
                  iVar13 = sqlite3ExprIsInteger(p_00,&local_d4);
                  if (iVar13 == 0) {
                    iVar15 = resolveAsName((Parse *)local_c8,(ExprList *)p_00,pE);
                    if (iVar15 == 0) {
                      pEVar18 = sqlite3ExprDup(psVar3,p_00,0);
                      iVar15 = 0;
                      if (psVar3->mallocFailed == '\0') {
                        local_78.pEList = (ExprList *)pPVar29->db;
                        local_68.pWinSelect = (Select *)0x0;
                        local_68.pNext = (NameContext *)0x0;
                        local_68.nRef = 0;
                        local_68.nErr = 0;
                        local_68.pSrcList = *(SrcList **)&pPVar29->nRangeReg;
                        local_68.ncFlags = 0x81;
                        local_68._42_6_ = 0;
                        psVar8 = pParse->db;
                        uVar2 = psVar8->suppressErr;
                        psVar8->suppressErr = '\x01';
                        local_d0 = pEVar18;
                        local_68.pParse = pParse;
                        local_68.uNC.pEList = local_78.pEList;
                        iVar13 = sqlite3ResolveExprNames(&local_68,pEVar18);
                        aVar10 = local_78;
                        psVar8->suppressErr = uVar2;
                        iVar15 = 0;
                        pEVar18 = local_d0;
                        if (iVar13 == 0) {
                          pEVar19 = (local_78.pEList)->a;
                          local_80 = p_00;
                          for (lVar26 = 0; pEVar18 = local_d0, p_00 = local_80, iVar15 = 0,
                              lVar26 < (aVar10.pEList)->nExpr; lVar26 = lVar26 + 1) {
                            uVar16 = sqlite3ExprCompare((Parse *)0x0,pEVar19->pExpr,local_d0,-1);
                            if (uVar16 < 2) {
                              pEVar18 = local_d0;
                              p_00 = local_80;
                              iVar15 = (int)lVar26 + 1;
                              break;
                            }
                            pEVar19 = pEVar19 + 1;
                          }
                        }
                      }
                      sqlite3ExprDelete(psVar3,pEVar18);
                    }
                    iVar13 = 1;
                    if (iVar15 < 1) goto LAB_00173c15;
                  }
                  else if ((local_d4 < 1) || (iVar15 = local_d4, *(int *)&local_c8->pVfs < local_d4)
                          ) {
                    resolveOutOfRangeError(pParse,"ORDER",iVar14 + 1,*(int *)&local_c8->pVfs);
                    goto LAB_00173946;
                  }
                  pEVar18 = sqlite3Expr(psVar3,0x8f,(char *)0x0);
                  if (pEVar18 == (Expr *)0x0) goto LAB_00173946;
                  pbVar1 = (byte *)((long)&pEVar18->flags + 1);
                  *pbVar1 = *pbVar1 | 4;
                  (pEVar18->u).iValue = iVar15;
                  pEVar19 = pEVar27;
                  pEVar9 = pEVar27->pExpr;
                  if (pEVar27->pExpr != p_00) {
                    do {
                      pEVar22 = pEVar9;
                      pEVar9 = pEVar22->pLeft;
                    } while (pEVar9->op == 'f');
                    pEVar19 = (ExprList_item *)&pEVar22->pLeft;
                  }
                  pEVar19->pExpr = pEVar18;
                  sqlite3ExprDelete(psVar3,p_00);
                  (pEVar27->u).x.iOrderByCol = (u16)iVar15;
                  pEVar27->field_0x19 = pEVar27->field_0x19 | 1;
                  iVar13 = (int)local_c0;
                }
LAB_00173c15:
                pEVar27 = pEVar27 + 1;
                uVar16 = pEVar7->nExpr;
              }
              pPVar29 = (Parse *)pPVar29->pConstExpr;
            }
            uVar20 = 0;
            uVar21 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar21 = uVar20;
            }
            iVar13 = 1;
            uVar23 = 1;
            for (; uVar21 * 0x20 != uVar20; uVar20 = uVar20 + 0x20) {
              if (((&pEVar7->a[0].field_0x19)[uVar20] & 1) == 0) {
                sqlite3ErrorMsg(pParse,
                                "%r ORDER BY term does not match any column in the result set",
                                uVar23);
                goto LAB_00173946;
              }
              uVar23 = (ulong)((int)uVar23 + 1);
            }
          }
        }
      }
    }
  }
  return iVar13;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}